

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

int peek(void)

{
  size_t sVar1;
  LexerState *pLVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  
  iVar3 = peekInternal('\0');
  sVar1 = lexerState->macroArgScanDistance;
  pLVar2 = lexerState;
  do {
    if (sVar1 != 0) {
      lexerState = pLVar2;
      return iVar3;
    }
    lexerState = pLVar2;
    pLVar2->macroArgScanDistance = 1;
    if (iVar3 == 0x7b) {
      if (pLVar2->disableInterpolation != false) {
        return 0x7b;
      }
      shiftChar();
      pcVar6 = readInterpolation(0);
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        beginExpansion(pcVar6,false,pcVar6);
      }
    }
    else {
      if (iVar3 != 0x5c) {
        return iVar3;
      }
      if (pLVar2->disableMacroArgs != false) {
        return 0x5c;
      }
      pLVar2->macroArgScanDistance = 2;
      uVar4 = peekInternal('\x01');
      uVar5 = (uVar4 & 0xff) - 0x23;
      if (((0x1d < uVar5) || ((0x22000001U >> (uVar5 & 0x1f) & 1) == 0)) &&
         (9 < (byte)((char)uVar4 - 0x30U))) {
        return 0x5c;
      }
      shiftChar();
      shiftChar();
      pcVar6 = readMacroArg((char)uVar4);
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        beginExpansion(pcVar6,uVar4 == 0x23,(char *)0x0);
        sVar7 = strlen(pcVar6);
        lexerState->macroArgScanDistance = lexerState->macroArgScanDistance + sVar7;
        return (int)*pcVar6;
      }
    }
    iVar3 = peekInternal('\0');
    sVar1 = lexerState->macroArgScanDistance;
    pLVar2 = lexerState;
  } while( true );
}

Assistant:

static int peek(void)
{
	int c = peekInternal(0);

	if (lexerState->macroArgScanDistance > 0)
		return c;

	lexerState->macroArgScanDistance++; // Do not consider again

	if (c == '\\' && !lexerState->disableMacroArgs) {
		// If character is a backslash, check for a macro arg
		lexerState->macroArgScanDistance++;
		c = peekInternal(1);
		if (isMacroChar(c)) {
			shiftChar();
			shiftChar();
			char const *str = readMacroArg(c);

			// If the macro arg is invalid or an empty string, it cannot be
			// expanded, so skip it and keep peeking.
			if (!str || !str[0])
				return peek();

			beginExpansion(str, c == '#', NULL);

			// Assuming macro args can't be recursive (I'll be damned if a way
			// is found...), then we mark the entire macro arg as scanned.
			lexerState->macroArgScanDistance += strlen(str);

			c = str[0];
		} else {
			c = '\\';
		}
	} else if (c == '{' && !lexerState->disableInterpolation) {
		// If character is an open brace, do symbol interpolation
		shiftChar();
		char const *str = readInterpolation(0);

		if (str && str[0])
			beginExpansion(str, false, str);
		return peek();
	}

	return c;
}